

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall
QDateTimeEditPrivate::QDateTimeEditPrivate(QDateTimeEditPrivate *this,QTimeZone *zone)

{
  long in_FS_OFFSET;
  QDate QStack_68;
  QDateTime local_60 [8];
  undefined8 local_58;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(&this->super_QAbstractSpinBoxPrivate);
  QCalendar::QCalendar((QCalendar *)&local_58);
  *(code **)&this->super_QDateTimeParser = QGuiApplication::primaryScreen;
  *(undefined8 *)&this->field_0x3e0 = 0x76cffffffff;
  *(undefined8 *)&this->field_0x3e8 = 0xffffffff00000000;
  *(undefined8 *)&this->field_0x3f0 = 0;
  *(undefined8 *)&this->field_0x3f8 = 0;
  *(undefined8 *)&this->field_0x400 = 0;
  *(undefined8 *)&this->field_0x408 = 0;
  *(undefined8 *)&this->field_0x410 = 0;
  *(undefined8 *)&this->field_0x418 = 0;
  *(undefined8 *)&this->field_0x420 = 0;
  *(undefined8 *)&this->field_0x428 = 0;
  *(undefined8 *)&this->field_0x430 = 0;
  *(undefined8 *)&this->field_0x438 = 0;
  *(undefined8 *)&this->field_0x440 = 0;
  *(undefined8 *)&this->field_0x448 = 0;
  QLocale::system();
  *(undefined4 *)&this->field_0x458 = 0x10;
  this->field_0x45c = 0;
  *(undefined4 *)&this->field_0x460 = 1;
  *(undefined8 *)&this->field_0x468 = local_58;
  *(undefined ***)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate =
       &PTR__QDateTimeEditPrivate_007ff560;
  *(undefined ***)&this->super_QDateTimeParser = &PTR__QDateTimeEditPrivate_007ff6a8;
  (this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
  super_QFlagsStorage<QDateTimeEdit::Section>.i = 0;
  this->cacheGuard = false;
  (this->defaultDateFormat).d.d = (Data *)0x0;
  (this->defaultDateFormat).d.ptr = (char16_t *)0x0;
  (this->defaultDateFormat).d.size = 0;
  (this->defaultTimeFormat).d.d = (Data *)0x0;
  (this->defaultTimeFormat).d.ptr = (char16_t *)0x0;
  (this->defaultTimeFormat).d.size = 0;
  (this->defaultDateTimeFormat).d.d = (Data *)0x0;
  (this->defaultDateTimeFormat).d.ptr = (char16_t *)0x0;
  (this->defaultDateTimeFormat).d.size = 0;
  (this->unreversedFormat).d.d = (Data *)0x0;
  (this->unreversedFormat).d.ptr = (char16_t *)0x0;
  (this->unreversedFormat).d.size = 0;
  (this->conflictGuard).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->conflictGuard).d.data + 8) = 0;
  *(undefined8 *)((long)&(this->conflictGuard).d.data + 0x10) = 0;
  *(undefined8 *)&(this->conflictGuard).d.field_0x18 = 2;
  this->hasHadFocus = false;
  this->formatExplicitlySet = false;
  this->calendarPopup = false;
  this->arrowState = State_None;
  this->monthCalendar = (QCalendarPopup *)0x0;
  QTimeZone::QTimeZone(&this->timeZone,zone);
  this->field_0x45c = 1;
  (this->super_QAbstractSpinBoxPrivate).type = QDateTime;
  *(undefined4 *)&this->field_0x3e0 = 0xfffffffe;
  QDate::QDate(&QStack_68,0x6d8,9,0xe);
  QDate::startOfDay((QTimeZone *)local_60);
  ::QVariant::QVariant(&local_50,local_60);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).minimum,&local_50);
  ::QVariant::~QVariant(&local_50);
  QDateTime::~QDateTime(local_60);
  QDate::QDate(&QStack_68,9999,0xc,0x1f);
  QDate::endOfDay((QTimeZone *)local_60);
  ::QVariant::QVariant(&local_50,local_60);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).maximum,&local_50);
  ::QVariant::~QVariant(&local_50);
  QDateTime::~QDateTime(local_60);
  readLocaleSettings(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEditPrivate::QDateTimeEditPrivate(const QTimeZone &zone)
    : QDateTimeParser(QMetaType::QDateTime, QDateTimeParser::DateTimeEdit, QCalendar()),
      timeZone(zone)
{
    fixday = true;
    type = QMetaType::QDateTime;
    currentSectionIndex = FirstSectionIndex;

    minimum = QDATETIMEEDIT_COMPAT_DATE_MIN.startOfDay(timeZone);
    maximum = QDATETIMEEDIT_DATE_MAX.endOfDay(timeZone);
    readLocaleSettings();
}